

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O3

ShaderCodeVariableDescX * __thiscall
Diligent::ShaderCodeVariableDescX::operator=
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *RHS)

{
  char *pcVar1;
  char *pcVar2;
  pointer pSVar3;
  SHADER_CODE_BASIC_TYPE SVar4;
  Uint8 UVar5;
  Uint8 UVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  Uint32 UVar9;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_28;
  
  (this->super_ShaderCodeVariableDesc).pMembers = (RHS->super_ShaderCodeVariableDesc).pMembers;
  pcVar1 = (RHS->super_ShaderCodeVariableDesc).Name;
  pcVar2 = (RHS->super_ShaderCodeVariableDesc).TypeName;
  SVar4 = (RHS->super_ShaderCodeVariableDesc).BasicType;
  UVar5 = (RHS->super_ShaderCodeVariableDesc).NumRows;
  UVar6 = (RHS->super_ShaderCodeVariableDesc).NumColumns;
  UVar7 = (RHS->super_ShaderCodeVariableDesc).Offset;
  UVar8 = (RHS->super_ShaderCodeVariableDesc).ArraySize;
  UVar9 = (RHS->super_ShaderCodeVariableDesc).NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = (RHS->super_ShaderCodeVariableDesc).Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar4;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar5;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar6;
  (this->super_ShaderCodeVariableDesc).Offset = UVar7;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar8;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar9;
  (this->super_ShaderCodeVariableDesc).Name = pcVar1;
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar2;
  local_28.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pSVar3 = (RHS->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (RHS->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (RHS->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (RHS->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (RHS->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (RHS->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::~vector(&local_28);
  std::__cxx11::string::operator=((string *)&this->NameCopy,(string *)&RHS->NameCopy);
  std::__cxx11::string::operator=((string *)&this->TypeNameCopy,(string *)&RHS->TypeNameCopy);
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).pMembers =
       &((this->Members).
         super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ShaderCodeVariableDesc;
  return this;
}

Assistant:

ShaderCodeVariableDescX& operator=(ShaderCodeVariableDescX&& RHS) noexcept
    {
        static_cast<ShaderCodeVariableDesc&>(*this) = RHS;

        Members      = std::move(RHS.Members);
        NameCopy     = std::move(RHS.NameCopy);
        TypeNameCopy = std::move(RHS.TypeNameCopy);

        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();

        return *this;
    }